

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_options.h
# Opt level: O1

void __thiscall google::protobuf::compiler::cpp::Options::~Options(Options *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->annotation_guard_name)._M_dataplus._M_p;
  paVar2 = &(this->annotation_guard_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->annotation_pragma_name)._M_dataplus._M_p;
  paVar2 = &(this->annotation_pragma_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->dllexport_decl)._M_dataplus._M_p;
  paVar2 = &(this->dllexport_decl).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Options()
      : safe_boundary_check(false),
        proto_h(false),
        transitive_pb_h(true),
        annotate_headers(false),
        enforce_lite(false),
        table_driven_parsing(false) {}